

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O1

BigInteger * __thiscall
BigInteger::_divide_long(BigInteger *__return_storage_ptr__,BigInteger *this,BigInteger *a)

{
  pointer *ppuVar1;
  pointer puVar2;
  pointer puVar3;
  uint *puVar4;
  iterator __position;
  BigInteger *pBVar5;
  uint uVar6;
  BigInteger *pBVar7;
  compare_t cVar8;
  pointer puVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  int r;
  uint uVar13;
  BigInteger ans;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  bool bStack_90;
  uint local_84;
  BigInteger *local_80;
  BigInteger *local_78;
  BigInteger local_70;
  BigInteger local_50;
  
  uVar10 = 0;
  a->negative = false;
  this->negative = false;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  bStack_90 = false;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  cVar8 = _compareAbs(this,a);
  if (cVar8 < CMP_EQUAL) {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->digits).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->digits).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 1) = 0;
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    cVar8 = _compareAbs(this,a);
    if (CMP_LESS < cVar8) {
      uVar10 = 0;
      do {
        local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
                  (&a->digits,
                   (const_iterator)
                   (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,(value_type *)&local_70);
        uVar10 = uVar10 + 1;
        cVar8 = _compareAbs(this,a);
      } while (CMP_LESS < cVar8);
    }
    puVar2 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar9 = puVar2 + 1;
    if (puVar9 != puVar3) {
      memmove(puVar2,puVar9,(long)puVar3 - (long)puVar9);
    }
    ppuVar1 = &(a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + -1;
    local_78 = __return_storage_ptr__;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_a8,(ulong)uVar10);
    pBVar7 = this;
    uVar13 = local_84;
    pBVar5 = local_80;
    __return_storage_ptr__ = local_78;
    for (; local_84 = uVar10, local_80 = pBVar7, local_78 = __return_storage_ptr__, local_84 != 0;
        uVar10 = uVar10 - 1) {
      uVar13 = 1000000000;
      uVar10 = 0;
      do {
        uVar12 = (int)(uVar13 + uVar10) / 2;
        BigInteger(&local_50,(long)(int)uVar12);
        ::operator*(&local_70,a,&local_50);
        cVar8 = _compareAbs(local_80,&local_70);
        if ((void *)CONCAT44(local_70.digits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             (uint)local_70.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_70.digits.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (uint)local_70.digits.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start));
        }
        if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar6 = uVar12;
        if (CMP_LESS < cVar8) {
          uVar6 = uVar13;
          uVar10 = uVar12;
        }
        uVar13 = uVar6;
      } while ((int)(uVar10 + 1) < (int)uVar13);
      __position._M_current._1_7_ =
           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish._1_7_;
      __position._M_current._0_1_ =
           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish._0_1_;
      local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = uVar10;
      if (__position._M_current ==
          (uint *)CONCAT71(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_a8,__position,(uint *)&local_70);
      }
      else {
        *__position._M_current = uVar10;
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = SUB81(__position._M_current + 1,0);
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish._1_7_ =
             (undefined7)((ulong)(__position._M_current + 1) >> 8);
      }
      BigInteger(&local_50,(long)(int)uVar10);
      ::operator*(&local_70,a,&local_50);
      operator-=(local_80,&local_70);
      if ((void *)CONCAT44(local_70.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           (uint)local_70.digits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_70.digits.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)local_70.digits.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start));
      }
      uVar10 = local_84;
      if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      puVar2 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar9 = puVar2 + 1;
      if (puVar9 != puVar3) {
        memmove(puVar2,puVar9,(long)puVar3 - (long)puVar9);
      }
      ppuVar1 = &(a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + -1;
      pBVar7 = local_80;
      uVar13 = local_84;
      pBVar5 = local_80;
      __return_storage_ptr__ = local_78;
    }
    puVar2 = (pointer)CONCAT71(local_a8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish._1_7_,
                               local_a8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish._0_1_);
    puVar9 = puVar2 + -1;
    puVar4 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start < puVar9 &&
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != puVar2) {
      do {
        puVar11 = puVar4 + 1;
        uVar10 = *puVar4;
        *puVar4 = *puVar9;
        *puVar9 = uVar10;
        puVar9 = puVar9 + -1;
        puVar4 = puVar11;
      } while (puVar11 < puVar9);
    }
    while ((puVar2 != local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start &&
           (puVar9 = puVar2 + -1, *puVar9 == 0))) {
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = SUB81(puVar9,0);
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = (undefined7)((ulong)puVar9 >> 8);
      puVar2 = puVar9;
    }
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start == puVar2) {
      bStack_90 = false;
    }
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish._1_7_,
                           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish._0_1_);
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT71(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    __return_storage_ptr__->negative = bStack_90;
    local_84 = uVar13;
    local_80 = pBVar5;
  }
  if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

const BigInteger BigInteger::_divide_long(BigInteger a) noexcept
{
    negative = a.negative = false;
    BigInteger ans;
    if(_compareAbs(a) < 0)
        return 0;
    int shift = 0;
    while(_compareAbs(a) >= 0)
    {
        a.digits.insert(a.digits.begin(), 0);
        ++shift;
    }
    a.digits.erase(a.digits.begin());
    ans.digits.reserve(shift);
    for(; shift; --shift)
    {
        int l = 0, r = BLOCK_MOD;
        while(l + 1 < r)
        {
            int m = (l + r) / 2;
            if(_compareAbs(a * m) < 0)
                r = m;
            else
                l = m;
        }
        ans.digits.push_back(l);
        *this -= a * l;
        a.digits.erase(a.digits.begin());
    }
    std::reverse(ans.digits.begin(), ans.digits.end());
    ans.normalize();
    return ans;
}